

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testValidCrop2(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  CropLayerParams *this_00;
  ShapeConstraint *pSVar7;
  ShapeRange *pSVar8;
  size_t sVar9;
  ostream *poVar10;
  int iVar11;
  char *pcVar12;
  RangeValue RVar13;
  allocator<char> local_109;
  string local_108;
  RangeValue local_e8;
  Model m1;
  Result res;
  NeuralNetworkShaper shaper;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,1);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xea);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0x14c);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input2");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,10);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,0xb);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"probs");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"probs");
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_crop(this);
  CoreML::Specification::CropLayerParams::add_offset(this_00,1);
  CoreML::Specification::CropLayerParams::add_offset(this_00,2);
  CoreML::validate<(MLModelType)500>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (!bVar1) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe93);
    poVar10 = std::operator<<(poVar10,": error: ");
    poVar10 = std::operator<<(poVar10,"(res).good()");
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar10);
    iVar11 = 1;
    goto LAB_00152a1b;
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper(&shaper,&m1,true);
  bVar1 = CoreML::NeuralNetworkShaper::isValid(&shaper);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
    RVar13 = CoreML::ShapeRange::minimum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (sVar9 != 1) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe98);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").channelRange().minimum().value() == 1";
      goto LAB_001529ed;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::channelRange(pSVar7);
    RVar13 = CoreML::ShapeRange::maximum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (sVar9 != 1) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe99);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").channelRange().maximum().value() == 1";
      goto LAB_001529ed;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
    RVar13 = CoreML::ShapeRange::minimum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (sVar9 != 10) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe9b);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").heightRange().minimum().value() == 10";
      goto LAB_001529ed;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::heightRange(pSVar7);
    RVar13 = CoreML::ShapeRange::maximum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (sVar9 != 10) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe9c);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").heightRange().maximum().value() == 10";
      goto LAB_001529ed;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
    RVar13 = CoreML::ShapeRange::minimum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    if (sVar9 != 0xb) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe9e);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").widthRange().minimum().value() == 11";
      goto LAB_001529ed;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"probs",&local_109);
    pSVar7 = CoreML::NeuralNetworkShaper::shape(&shaper,&local_108);
    pSVar8 = CoreML::ShapeConstraint::widthRange(pSVar7);
    RVar13 = CoreML::ShapeRange::maximum(pSVar8);
    local_e8._val = RVar13._val;
    local_e8._isUnbound = RVar13._isUnbound;
    sVar9 = CoreML::RangeValue::value(&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    iVar11 = 0;
    if (sVar9 != 0xb) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                               );
      poVar10 = std::operator<<(poVar10,":");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe9f);
      poVar10 = std::operator<<(poVar10,": error: ");
      pcVar12 = "shaper.shape(\"probs\").widthRange().maximum().value() == 11";
      goto LAB_001529ed;
    }
  }
  else {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             );
    poVar10 = std::operator<<(poVar10,":");
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,0xe96);
    poVar10 = std::operator<<(poVar10,": error: ");
    pcVar12 = "shaper.isValid()";
LAB_001529ed:
    poVar10 = std::operator<<(poVar10,pcVar12);
    poVar10 = std::operator<<(poVar10," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar10);
    iVar11 = 1;
  }
  CoreML::NeuralNetworkShaper::~NeuralNetworkShaper(&shaper);
LAB_00152a1b:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar11;
}

Assistant:

int testValidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(234);
    shape->add_shape(332);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);
    shape2->add_shape(10);
    shape2->add_shape(11);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);
    params->add_offset(2);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    NeuralNetworkShaper shaper(m1);
    ML_ASSERT(shaper.isValid());

    ML_ASSERT(shaper.shape("probs").channelRange().minimum().value() == 1);
    ML_ASSERT(shaper.shape("probs").channelRange().maximum().value() == 1);

    ML_ASSERT(shaper.shape("probs").heightRange().minimum().value() == 10);
    ML_ASSERT(shaper.shape("probs").heightRange().maximum().value() == 10);

    ML_ASSERT(shaper.shape("probs").widthRange().minimum().value() == 11);
    ML_ASSERT(shaper.shape("probs").widthRange().maximum().value() == 11);

    return 0;
}